

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall
baryonyx::details::pi_file_observer::pi_file_observer
          (pi_file_observer *this,string_view filename,int m,int param_3,long param_4)

{
  basic_string_view<char> bVar1;
  string_view format_str;
  format_args args;
  string sStack_48;
  char *local_28;
  size_t local_20;
  
  local_28 = filename._M_str;
  local_20 = filename._M_len;
  this->constraints = m;
  bVar1 = ::fmt::v7::to_string_view<char,_0>("{}-pi.txt");
  format_str.data_ = (char *)bVar1.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
              )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                )param_4;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_28;
  ::fmt::v7::detail::vformat_abi_cxx11_(&sStack_48,(detail *)bVar1.data_,format_str,args);
  std::ofstream::ofstream(&this->m_ofs,(string *)&sStack_48,_S_out);
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

pi_file_observer(const std::string_view filename,
                     int m,
                     int /*n*/,
                     long int /*loop*/)
      : constraints(m)
      , m_ofs(fmt::format("{}-pi.txt", filename))
    {}